

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.hpp
# Opt level: O0

ostream * dump(ostream *os,block *b)

{
  ostream *poVar1;
  void *this;
  string local_38 [32];
  block *local_18;
  block *b_local;
  ostream *os_local;
  
  local_18 = b;
  b_local = (block *)os;
  poVar1 = std::operator<<(os,"index    = ");
  this = (void *)std::ostream::operator<<(poVar1,local_18->idx);
  poVar1 = (ostream *)std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"timestamp= ");
  format_timestamp_abi_cxx11_((uint64_t)local_38);
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"prevhash = ");
  poVar1 = std::operator<<(poVar1,(string *)&local_18->prevsha256);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"hash     = ");
  poVar1 = std::operator<<(poVar1,(string *)&local_18->sha256);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  return (ostream *)b_local;
}

Assistant:

inline
std::ostream& dump(std::ostream &os, const block &b) {
    os
    << "index    = " << b.idx << std::endl
    << "timestamp= " << format_timestamp(b.timestamp) << std::endl
    << "prevhash = " << b.prevsha256 << std::endl
    << "hash     = " << b.sha256 << std::endl;

    return os;
}